

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O3

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullPath_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_b8;
  undefined8 local_98;
  undefined8 local_90;
  undefined1 *local_88;
  undefined1 local_80 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  size_type local_30;
  pointer local_28;
  undefined1 *local_20;
  
  if ((this->Directory)._M_string_length == 0) {
    GetFullName_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    GetFullName_abi_cxx11_(&local_b8,this);
    local_60.first._M_str = (this->Directory)._M_dataplus._M_p;
    local_60.first._M_len = (this->Directory)._M_string_length;
    local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88 = local_80;
    local_98 = 0;
    local_90 = 1;
    local_80[0] = 0x2f;
    local_48 = 1;
    local_38 = 0;
    local_30 = local_b8._M_string_length;
    local_28 = local_b8._M_dataplus._M_p;
    views._M_len = 3;
    views._M_array = &local_60;
    local_40 = local_88;
    local_20 = (undefined1 *)&local_b8;
    cmCatViews(__return_storage_ptr__,views);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullPath() const
    {
      return this->Directory.empty()
        ? this->GetFullName()
        : cmStrCat(this->Directory, '/', this->GetFullName());
    }